

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Goblin.cpp
# Opt level: O3

void __thiscall Goblin::Goblin(Goblin *this)

{
  Dice *pDVar1;
  
  (this->super_Character).name._M_dataplus._M_p = (pointer)&(this->super_Character).name.field_2;
  (this->super_Character).name._M_string_length = 0;
  (this->super_Character).name.field_2._M_local_buf[0] = '\0';
  (this->super_Character)._vptr_Character = (_func_int **)&PTR_RollAttack_00108d18;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Character).name,0,(char *)0x0,0x106150);
  (this->super_Character).alive = true;
  (this->super_Character).attackRolls = 2;
  (this->super_Character).attackDieSides = 6;
  (this->super_Character).defenceRolls = 1;
  (this->super_Character).defenceDieSides = 6;
  (this->super_Character).armor = 3;
  (this->super_Character).totalStrengthPoints = 8;
  (this->super_Character).currentStrengthPoints = 8;
  this->cutOpponentTendon = false;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,6);
  (this->super_Character).attackDie = pDVar1;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,(this->super_Character).defenceDieSides);
  (this->super_Character).defenseDie = pDVar1;
  return;
}

Assistant:

Goblin::Goblin()
{
    name = "Goblin";

    alive = true;
    attackDieSides = 6;
    attackRolls = 2;
    defenceDieSides = 6;
    defenceRolls = 1;

    armor = 3;
    totalStrengthPoints = 8;
    currentStrengthPoints = totalStrengthPoints;
    cutOpponentTendon = false;

    attackDie = new Dice(attackDieSides);
    defenseDie = new Dice(defenceDieSides);
}